

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall
Catch::anon_unknown_23::TapAssertionPrinter::printExpressionWas(TapAssertionPrinter *this)

{
  bool bVar1;
  Code _colourCode;
  Colour local_11;
  TapAssertionPrinter *pTStack_10;
  Colour colour;
  TapAssertionPrinter *this_local;
  
  pTStack_10 = this;
  bVar1 = AssertionResult::hasExpression(this->result);
  if (bVar1) {
    std::operator<<(this->stream,';');
    _colourCode = dimColour();
    Colour::Colour(&local_11,_colourCode);
    std::operator<<(this->stream," expression was:");
    Colour::~Colour(&local_11);
    printOriginalExpression(this);
  }
  return;
}

Assistant:

void printExpressionWas() {
                if (result.hasExpression()) {
                    stream << ';';
                    {
                        Colour colour(dimColour());
                        stream << " expression was:";
                    }
                    printOriginalExpression();
                }
            }